

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_quake.cpp
# Opt level: O0

int DEarthquake::StaticGetQuakeIntensities(AActor *victim,FQuakeJiggers *jiggers)

{
  bool bVar1;
  DEarthquake *this;
  AActor *this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 local_80 [8];
  DVector3 intensity;
  double strength;
  double r;
  double falloff;
  double dist;
  int count;
  DEarthquake *quake;
  TThinkerIterator<DEarthquake> iterator;
  FQuakeJiggers *jiggers_local;
  AActor *victim_local;
  
  if ((victim->player == (player_t *)0x0) || ((victim->player->cheats & 1U) == 0)) {
    iterator.super_FThinkerIterator._16_8_ = jiggers;
    TThinkerIterator<DEarthquake>::TThinkerIterator((TThinkerIterator<DEarthquake> *)&quake,0x28);
    dist._4_4_ = 0;
    while (this = TThinkerIterator<DEarthquake>::Next((TThinkerIterator<DEarthquake> *)&quake,false)
          , this != (DEarthquake *)0x0) {
      bVar1 = TObjPtr<AActor>::operator!=(&this->m_Spot,(AActor *)0x0);
      if (bVar1) {
        this_00 = TObjPtr<AActor>::operator->(&this->m_Spot);
        dVar2 = AActor::Distance2D(this_00,victim,true);
        if (dVar2 < this->m_TremorRadius) {
          dist._4_4_ = dist._4_4_ + 1;
          dVar2 = GetFalloff(this,dVar2);
          dVar3 = GetModIntensity(this,this->m_RollIntensity,false);
          intensity.Z = GetModIntensity(this,1.0,true);
          TVector3<double>::TVector3((TVector3<double> *)local_80);
          local_80 = (undefined1  [8])GetModIntensity(this,(this->m_Intensity).X,false);
          intensity.X = GetModIntensity(this,(this->m_Intensity).Y,false);
          intensity.Y = GetModIntensity(this,(this->m_Intensity).Z,false);
          if ((this->m_Flags & 0x20U) == 0) {
            dVar3 = MAX<double>(dVar3,*(double *)(iterator.super_FThinkerIterator._16_8_ + 0x60));
            *(double *)(iterator.super_FThinkerIterator._16_8_ + 0x60) = dVar3 * dVar2;
            TVector3<double>::operator*=((TVector3<double> *)local_80,dVar2);
            if ((this->m_Flags & 1U) == 0) {
              dVar2 = MAX<double>((double)local_80,*(double *)iterator.super_FThinkerIterator._16_8_
                                 );
              *(double *)iterator.super_FThinkerIterator._16_8_ = dVar2;
              dVar2 = MAX<double>(intensity.X,
                                  *(double *)(iterator.super_FThinkerIterator._16_8_ + 8));
              *(double *)(iterator.super_FThinkerIterator._16_8_ + 8) = dVar2;
              dVar2 = MAX<double>(intensity.Y,
                                  *(double *)(iterator.super_FThinkerIterator._16_8_ + 0x10));
              *(double *)(iterator.super_FThinkerIterator._16_8_ + 0x10) = dVar2;
            }
            else {
              dVar2 = MAX<double>((double)local_80,
                                  *(double *)(iterator.super_FThinkerIterator._16_8_ + 0x18));
              *(double *)(iterator.super_FThinkerIterator._16_8_ + 0x18) = dVar2;
              dVar2 = MAX<double>(intensity.X,
                                  *(double *)(iterator.super_FThinkerIterator._16_8_ + 0x20));
              *(double *)(iterator.super_FThinkerIterator._16_8_ + 0x20) = dVar2;
              dVar2 = MAX<double>(intensity.Y,
                                  *(double *)(iterator.super_FThinkerIterator._16_8_ + 0x28));
              *(double *)(iterator.super_FThinkerIterator._16_8_ + 0x28) = dVar2;
            }
          }
          else {
            dVar4 = GetModWave(this,this->m_RollWave);
            *(double *)(iterator.super_FThinkerIterator._16_8_ + 0x68) =
                 dVar3 * dVar4 * dVar2 * intensity.Z;
            dVar3 = GetModWave(this,(this->m_WaveSpeed).X);
            local_80 = (undefined1  [8])(dVar3 * (double)local_80);
            dVar3 = GetModWave(this,(this->m_WaveSpeed).Y);
            intensity.X = dVar3 * intensity.X;
            dVar3 = GetModWave(this,(this->m_WaveSpeed).Z);
            intensity.Y = dVar3 * intensity.Y;
            TVector3<double>::operator*=((TVector3<double> *)local_80,intensity.Z * dVar2);
            if ((this->m_Flags & 1U) == 0) {
              TVector3<double>::operator+=
                        ((TVector3<double> *)(iterator.super_FThinkerIterator._16_8_ + 0x30),
                         (TVector3<double> *)local_80);
            }
            else {
              TVector3<double>::operator+=
                        ((TVector3<double> *)(iterator.super_FThinkerIterator._16_8_ + 0x48),
                         (TVector3<double> *)local_80);
            }
          }
        }
      }
    }
    victim_local._4_4_ = dist._4_4_;
  }
  else {
    victim_local._4_4_ = 0;
  }
  return victim_local._4_4_;
}

Assistant:

int DEarthquake::StaticGetQuakeIntensities(AActor *victim, FQuakeJiggers &jiggers)
{
	if (victim->player != NULL && (victim->player->cheats & CF_NOCLIP))
	{
		return 0;
	}

	TThinkerIterator<DEarthquake> iterator(STAT_EARTHQUAKE);
	DEarthquake *quake;
	int count = 0;

	while ( (quake = iterator.Next()) != nullptr)
	{
		if (quake->m_Spot != nullptr)
		{
			const double dist = quake->m_Spot->Distance2D(victim, true);
			if (dist < quake->m_TremorRadius)
			{
				++count;
				const double falloff = quake->GetFalloff(dist);
				const double r = quake->GetModIntensity(quake->m_RollIntensity);
				const double strength = quake->GetModIntensity(1.0, true);
				DVector3 intensity;
				intensity.X = quake->GetModIntensity(quake->m_Intensity.X);
				intensity.Y = quake->GetModIntensity(quake->m_Intensity.Y);
				intensity.Z = quake->GetModIntensity(quake->m_Intensity.Z);

				if (!(quake->m_Flags & QF_WAVE))
				{
					jiggers.RollIntensity = MAX(r, jiggers.RollIntensity) * falloff;

					intensity *= falloff;
					if (quake->m_Flags & QF_RELATIVE)
					{
						jiggers.RelIntensity.X = MAX(intensity.X, jiggers.RelIntensity.X);
						jiggers.RelIntensity.Y = MAX(intensity.Y, jiggers.RelIntensity.Y);
						jiggers.RelIntensity.Z = MAX(intensity.Z, jiggers.RelIntensity.Z);
					}
					else
					{
						jiggers.Intensity.X = MAX(intensity.X, jiggers.Intensity.X);
						jiggers.Intensity.Y = MAX(intensity.Y, jiggers.Intensity.Y);
						jiggers.Intensity.Z = MAX(intensity.Z, jiggers.Intensity.Z);
					}
				}
				else
				{
					jiggers.RollWave = r * quake->GetModWave(quake->m_RollWave) * falloff * strength;

					
					intensity.X *= quake->GetModWave(quake->m_WaveSpeed.X);
					intensity.Y *= quake->GetModWave(quake->m_WaveSpeed.Y);
					intensity.Z *= quake->GetModWave(quake->m_WaveSpeed.Z);
					intensity *= strength * falloff;

					// [RH] This only gives effect to the last sine quake. I would
					// prefer if some way was found to make multiples coexist
					// peacefully, but just summing them together is undesirable
					// because they could cancel each other out depending on their
					// relative phases.

					// [MC] Now does so. And they stack rather well. I'm a little
					// surprised at how easy it was.

					
					if (quake->m_Flags & QF_RELATIVE)
					{
						jiggers.RelOffset += intensity;
					}
					else
					{
						jiggers.Offset += intensity;
					}
				}
			}
		}
	}
	return count;
}